

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int *piVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  Int IVar7;
  Int IVar8;
  Int IVar9;
  Int IVar10;
  time_t tVar11;
  Value *pVVar12;
  long *plVar13;
  Value *pVVar14;
  ulong uVar15;
  CommentInfo **ppCVar16;
  _func_int **pp_Var17;
  long *plVar18;
  size_type *psVar19;
  pointer *ppbVar20;
  size_t __n;
  uint uVar21;
  uint uVar22;
  string si1;
  Value output;
  StyledWriter writer;
  string so1;
  string so0;
  ofstream fout;
  allocator local_6bd;
  uint local_6bc;
  undefined1 local_6b8 [104];
  ValueHolder local_650;
  long local_648;
  CommentInfo *local_640;
  long lStack_638;
  ValueHolder local_628;
  long local_620;
  pointer local_618;
  long lStack_610;
  long *local_5b8;
  long local_5b0;
  long local_5a8;
  long lStack_5a0;
  long *local_598;
  long local_590;
  long local_588;
  long lStack_580;
  undefined1 *local_578 [2];
  undefined1 local_568 [16];
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  ValueHolder local_4d8;
  long local_4d0;
  CommentInfo *local_4c8;
  long lStack_4c0;
  ios_base local_3e0 [264];
  Value local_2d8;
  Value local_2b0;
  Value local_288;
  Value local_260;
  Value local_238;
  Value local_210;
  Value local_1e8;
  Value local_1c0;
  Value local_198;
  Value local_170;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  local_6b8._96_8_ = argv;
  if (argc == 4) {
    local_6bc = 0xfffffffe;
    do {
      printf("Round %d\n",(ulong)(uint)turnID);
      if (turnID == 1) {
        tVar11 = time((time_t *)0x0);
        srand((uint)tVar11);
        iVar5 = rand();
        Json::Value::Value(&local_120,iVar5 % 7);
        pVVar12 = Json::Value::operator[](&logger,0);
        pVVar12 = Json::Value::operator[](pVVar12,0);
        pVVar12 = Json::Value::operator[](pVVar12,"block");
        Json::Value::operator=(pVVar12,&local_120);
        Json::Value::~Value(&local_120);
        Json::Value::Value(&local_148,0);
        pVVar12 = Json::Value::operator[](&logger,0);
        pVVar12 = Json::Value::operator[](pVVar12,0);
        pVVar12 = Json::Value::operator[](pVVar12,"color");
        Json::Value::operator=(pVVar12,&local_148);
        Json::Value::~Value(&local_148);
        Json::Value::Value(&local_170,iVar5 % 7);
        pVVar12 = Json::Value::operator[](&logger,0);
        pVVar12 = Json::Value::operator[](pVVar12,1);
        pVVar12 = Json::Value::operator[](pVVar12,"block");
        Json::Value::operator=(pVVar12,&local_170);
        Json::Value::~Value(&local_170);
        Json::Value::Value(&local_198,1);
        pVVar12 = Json::Value::operator[](&logger,0);
        pVVar12 = Json::Value::operator[](pVVar12,1);
        pVVar12 = Json::Value::operator[](pVVar12,"color");
        Json::Value::operator=(pVVar12,&local_198);
        Json::Value::~Value(&local_198);
      }
      uVar2 = -turnID;
      if (0 < turnID) {
        uVar2 = turnID;
      }
      uVar21 = 1;
      local_628.string_ = (char *)&local_618;
      if (9 < uVar2) {
        uVar15 = (ulong)uVar2;
        uVar22 = 4;
        do {
          uVar21 = uVar22;
          uVar6 = (uint)uVar15;
          if (uVar6 < 100) {
            uVar21 = uVar21 - 2;
            goto LAB_0010bd5a;
          }
          if (uVar6 < 1000) {
            uVar21 = uVar21 - 1;
            goto LAB_0010bd5a;
          }
          if (uVar6 < 10000) goto LAB_0010bd5a;
          uVar15 = uVar15 / 10000;
          uVar22 = uVar21 + 4;
        } while (99999 < uVar6);
        uVar21 = uVar21 + 1;
      }
LAB_0010bd5a:
      uVar22 = (uint)turnID >> 0x1f;
      std::__cxx11::string::_M_construct((ulong)&local_628,(char)uVar21 - (char)(turnID >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>(local_628.string_ + uVar22,uVar21,uVar2);
      plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_628,0,(char *)0x0,0x11a08f);
      local_4d8.string_ = (char *)&local_4c8;
      ppCVar16 = (CommentInfo **)(plVar13 + 2);
      if ((CommentInfo **)*plVar13 == ppCVar16) {
        local_4c8 = *ppCVar16;
        lStack_4c0 = plVar13[3];
      }
      else {
        local_4c8 = *ppCVar16;
        local_4d8.string_ = ((char *)*plVar13).string_;
      }
      local_4d0 = plVar13[1];
      *plVar13 = (long)ppCVar16;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_4d8.int_);
      local_650.string_ = (char *)&local_640;
      ppCVar16 = (CommentInfo **)(plVar13 + 2);
      if ((CommentInfo **)*plVar13 == ppCVar16) {
        local_640 = *ppCVar16;
        lStack_638 = plVar13[3];
      }
      else {
        local_640 = *ppCVar16;
        local_650.string_ = ((char *)*plVar13).string_;
      }
      local_648 = plVar13[1];
      *plVar13 = (long)ppCVar16;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      if (local_4d8 != &local_4c8) {
        operator_delete(local_4d8.string_);
      }
      if (local_628 != &local_618) {
        operator_delete(local_628.string_);
      }
      uVar2 = -turnID;
      if (0 < turnID) {
        uVar2 = turnID;
      }
      uVar21 = 1;
      local_628.string_ = (char *)&local_618;
      if (9 < uVar2) {
        uVar15 = (ulong)uVar2;
        uVar22 = 4;
        do {
          uVar21 = uVar22;
          uVar6 = (uint)uVar15;
          if (uVar6 < 100) {
            uVar21 = uVar21 - 2;
            goto LAB_0010beee;
          }
          if (uVar6 < 1000) {
            uVar21 = uVar21 - 1;
            goto LAB_0010beee;
          }
          if (uVar6 < 10000) goto LAB_0010beee;
          uVar15 = uVar15 / 10000;
          uVar22 = uVar21 + 4;
        } while (99999 < uVar6);
        uVar21 = uVar21 + 1;
      }
LAB_0010beee:
      uVar22 = (uint)turnID >> 0x1f;
      std::__cxx11::string::_M_construct((ulong)&local_628,(char)uVar21 - (char)(turnID >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>(local_628.string_ + uVar22,uVar21,uVar2);
      plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_628,0,(char *)0x0,0x11a08f);
      local_4d8.string_ = (char *)&local_4c8;
      ppCVar16 = (CommentInfo **)(plVar13 + 2);
      if ((CommentInfo **)*plVar13 == ppCVar16) {
        local_4c8 = *ppCVar16;
        lStack_4c0 = plVar13[3];
      }
      else {
        local_4c8 = *ppCVar16;
        local_4d8.string_ = ((char *)*plVar13).string_;
      }
      local_4d0 = plVar13[1];
      *plVar13 = (long)ppCVar16;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_4d8.int_);
      local_6b8._0_8_ = local_6b8 + 0x10;
      pp_Var17 = (_func_int **)(plVar13 + 2);
      if ((_func_int **)*plVar13 == pp_Var17) {
        local_6b8._16_8_ = *pp_Var17;
        local_6b8._24_8_ = plVar13[3];
      }
      else {
        local_6b8._16_8_ = *pp_Var17;
        local_6b8._0_8_ = (_func_int **)*plVar13;
      }
      local_6b8._8_8_ = plVar13[1];
      *plVar13 = (long)pp_Var17;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      if (local_4d8 != &local_4c8) {
        operator_delete(local_4d8.string_);
      }
      if (local_628 != &local_618) {
        operator_delete(local_628.string_);
      }
      local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4f8,local_650.int_,local_650.string_ + local_648);
      makeInput(0,&local_4f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
        operator_delete(local_4f8._M_dataplus._M_p);
      }
      local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_518,local_6b8._0_8_,
                 (char *)((long)&((_Alloc_hider *)local_6b8._8_8_)->_M_p + local_6b8._0_8_));
      makeInput(1,&local_518);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._M_dataplus._M_p != &local_518.field_2) {
        operator_delete(local_518._M_dataplus._M_p);
      }
      uVar2 = -turnID;
      if (0 < turnID) {
        uVar2 = turnID;
      }
      uVar21 = 1;
      local_628.string_ = (char *)&local_618;
      if (9 < uVar2) {
        uVar15 = (ulong)uVar2;
        uVar22 = 4;
        do {
          uVar21 = uVar22;
          uVar6 = (uint)uVar15;
          if (uVar6 < 100) {
            uVar21 = uVar21 - 2;
            goto LAB_0010c125;
          }
          if (uVar6 < 1000) {
            uVar21 = uVar21 - 1;
            goto LAB_0010c125;
          }
          if (uVar6 < 10000) goto LAB_0010c125;
          uVar15 = uVar15 / 10000;
          uVar22 = uVar21 + 4;
        } while (99999 < uVar6);
        uVar21 = uVar21 + 1;
      }
LAB_0010c125:
      uVar22 = (uint)turnID >> 0x1f;
      std::__cxx11::string::_M_construct((ulong)&local_628,(char)uVar21 - (char)(turnID >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>(local_628.string_ + uVar22,uVar21,uVar2);
      plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_628,0,(char *)0x0,0x11a0a1);
      local_4d8.string_ = (char *)&local_4c8;
      ppCVar16 = (CommentInfo **)(plVar13 + 2);
      if ((CommentInfo **)*plVar13 == ppCVar16) {
        local_4c8 = *ppCVar16;
        lStack_4c0 = plVar13[3];
      }
      else {
        local_4c8 = *ppCVar16;
        local_4d8.string_ = ((char *)*plVar13).string_;
      }
      local_4d0 = plVar13[1];
      *plVar13 = (long)ppCVar16;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_4d8.int_);
      local_598 = &local_588;
      plVar18 = plVar13 + 2;
      if ((long *)*plVar13 == plVar18) {
        local_588 = *plVar18;
        lStack_580 = plVar13[3];
      }
      else {
        local_588 = *plVar18;
        local_598 = (long *)*plVar13;
      }
      local_590 = plVar13[1];
      *plVar13 = (long)plVar18;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      if (local_4d8 != &local_4c8) {
        operator_delete(local_4d8.string_);
      }
      if (local_628 != &local_618) {
        operator_delete(local_628.string_);
      }
      uVar2 = -turnID;
      if (0 < turnID) {
        uVar2 = turnID;
      }
      uVar21 = 1;
      local_628.string_ = (char *)&local_618;
      if (9 < uVar2) {
        uVar15 = (ulong)uVar2;
        uVar22 = 4;
        do {
          uVar21 = uVar22;
          uVar6 = (uint)uVar15;
          if (uVar6 < 100) {
            uVar21 = uVar21 - 2;
            goto LAB_0010c2bf;
          }
          if (uVar6 < 1000) {
            uVar21 = uVar21 - 1;
            goto LAB_0010c2bf;
          }
          if (uVar6 < 10000) goto LAB_0010c2bf;
          uVar15 = uVar15 / 10000;
          uVar22 = uVar21 + 4;
        } while (99999 < uVar6);
        uVar21 = uVar21 + 1;
      }
LAB_0010c2bf:
      uVar22 = (uint)turnID >> 0x1f;
      std::__cxx11::string::_M_construct((ulong)&local_628,(char)uVar21 - (char)(turnID >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>(local_628.string_ + uVar22,uVar21,uVar2);
      plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_628,0,(char *)0x0,0x11a0a1);
      local_4d8.string_ = (char *)&local_4c8;
      ppCVar16 = (CommentInfo **)(plVar13 + 2);
      if ((CommentInfo **)*plVar13 == ppCVar16) {
        local_4c8 = *ppCVar16;
        lStack_4c0 = plVar13[3];
      }
      else {
        local_4c8 = *ppCVar16;
        local_4d8.string_ = ((char *)*plVar13).string_;
      }
      local_4d0 = plVar13[1];
      *plVar13 = (long)ppCVar16;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_4d8.int_);
      local_5b8 = &local_5a8;
      plVar18 = plVar13 + 2;
      if ((long *)*plVar13 == plVar18) {
        local_5a8 = *plVar18;
        lStack_5a0 = plVar13[3];
      }
      else {
        local_5a8 = *plVar18;
        local_5b8 = (long *)*plVar13;
      }
      local_5b0 = plVar13[1];
      *plVar13 = (long)plVar18;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      if (local_4d8 != &local_4c8) {
        operator_delete(local_4d8.string_);
      }
      if (local_628 != &local_618) {
        operator_delete(local_628.string_);
      }
      std::__cxx11::string::string((string *)local_578,*(char **)(local_6b8._96_8_ + 8),&local_6bd);
      plVar13 = (long *)std::__cxx11::string::append((char *)local_578);
      local_6b8._32_8_ = local_6b8 + 0x30;
      psVar19 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar19) {
        local_6b8._48_8_ = *psVar19;
        local_6b8._56_8_ = plVar13[3];
      }
      else {
        local_6b8._48_8_ = *psVar19;
        local_6b8._32_8_ = (size_type *)*plVar13;
      }
      local_6b8._40_8_ = plVar13[1];
      *plVar13 = (long)psVar19;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::_M_append(local_6b8 + 0x20,local_650.uint_);
      local_6b8._64_8_ = local_6b8 + 0x50;
      psVar19 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar19) {
        local_6b8._80_8_ = *psVar19;
        local_6b8._88_8_ = plVar13[3];
      }
      else {
        local_6b8._80_8_ = *psVar19;
        local_6b8._64_8_ = (size_type *)*plVar13;
      }
      local_6b8._72_8_ = plVar13[1];
      *plVar13 = (long)psVar19;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::append(local_6b8 + 0x40);
      local_628.string_ = (char *)&local_618;
      ppbVar20 = (pointer *)(plVar13 + 2);
      if ((pointer *)*plVar13 == ppbVar20) {
        local_618 = *ppbVar20;
        lStack_610 = plVar13[3];
      }
      else {
        local_618 = *ppbVar20;
        local_628.string_ = ((char *)*plVar13).string_;
      }
      local_620 = plVar13[1];
      *plVar13 = (long)ppbVar20;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_628.int_,(ulong)local_598);
      local_4d8.string_ = (char *)&local_4c8;
      ppCVar16 = (CommentInfo **)(plVar13 + 2);
      if ((CommentInfo **)*plVar13 == ppCVar16) {
        local_4c8 = *ppCVar16;
        lStack_4c0 = plVar13[3];
      }
      else {
        local_4c8 = *ppCVar16;
        local_4d8.string_ = ((char *)*plVar13).string_;
      }
      local_4d0 = plVar13[1];
      *plVar13 = (long)ppCVar16;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      system(local_4d8.string_);
      if (local_4d8 != &local_4c8) {
        operator_delete(local_4d8.string_);
      }
      if (local_628 != &local_618) {
        operator_delete(local_628.string_);
      }
      if ((undefined1 *)local_6b8._64_8_ != local_6b8 + 0x50) {
        operator_delete((void *)local_6b8._64_8_);
      }
      if ((undefined1 *)local_6b8._32_8_ != local_6b8 + 0x30) {
        operator_delete((void *)local_6b8._32_8_);
      }
      if (local_578[0] != local_568) {
        operator_delete(local_578[0]);
      }
      std::__cxx11::string::string
                ((string *)local_578,*(char **)(local_6b8._96_8_ + 0x10),&local_6bd);
      plVar13 = (long *)std::__cxx11::string::append((char *)local_578);
      local_6b8._32_8_ = local_6b8 + 0x30;
      psVar19 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar19) {
        local_6b8._48_8_ = *psVar19;
        local_6b8._56_8_ = plVar13[3];
      }
      else {
        local_6b8._48_8_ = *psVar19;
        local_6b8._32_8_ = (size_type *)*plVar13;
      }
      local_6b8._40_8_ = plVar13[1];
      *plVar13 = (long)psVar19;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::_M_append(local_6b8 + 0x20,local_6b8._0_8_);
      local_6b8._64_8_ = local_6b8 + 0x50;
      psVar19 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar19) {
        local_6b8._80_8_ = *psVar19;
        local_6b8._88_8_ = plVar13[3];
      }
      else {
        local_6b8._80_8_ = *psVar19;
        local_6b8._64_8_ = (size_type *)*plVar13;
      }
      local_6b8._72_8_ = plVar13[1];
      *plVar13 = (long)psVar19;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::append(local_6b8 + 0x40);
      local_628.string_ = (char *)&local_618;
      ppbVar20 = (pointer *)(plVar13 + 2);
      if ((pointer *)*plVar13 == ppbVar20) {
        local_618 = *ppbVar20;
        lStack_610 = plVar13[3];
      }
      else {
        local_618 = *ppbVar20;
        local_628.string_ = ((char *)*plVar13).string_;
      }
      local_620 = plVar13[1];
      *plVar13 = (long)ppbVar20;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_628.int_,(ulong)local_5b8);
      local_4d8.string_ = (char *)&local_4c8;
      ppCVar16 = (CommentInfo **)(plVar13 + 2);
      if ((CommentInfo **)*plVar13 == ppCVar16) {
        local_4c8 = *ppCVar16;
        lStack_4c0 = plVar13[3];
      }
      else {
        local_4c8 = *ppCVar16;
        local_4d8.string_ = ((char *)*plVar13).string_;
      }
      local_4d0 = plVar13[1];
      *plVar13 = (long)ppCVar16;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      system(local_4d8.string_);
      if (local_4d8 != &local_4c8) {
        operator_delete(local_4d8.string_);
      }
      if (local_628 != &local_618) {
        operator_delete(local_628.string_);
      }
      if ((undefined1 *)local_6b8._64_8_ != local_6b8 + 0x50) {
        operator_delete((void *)local_6b8._64_8_);
      }
      if ((undefined1 *)local_6b8._32_8_ != local_6b8 + 0x30) {
        operator_delete((void *)local_6b8._32_8_);
      }
      if (local_578[0] != local_568) {
        operator_delete(local_578[0]);
      }
      Json::Value::Value((Value *)&local_4d8,nullValue);
      Json::Value::Value((Value *)&local_628,nullValue);
      local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_538,local_598,local_590 + (long)local_598);
      getOutput(&local_58,&local_538);
      Json::Value::operator=((Value *)&local_4d8,&local_58);
      Json::Value::~Value(&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_538._M_dataplus._M_p != &local_538.field_2) {
        operator_delete(local_538._M_dataplus._M_p);
      }
      local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_558,local_5b8,local_5b0 + (long)local_5b8);
      getOutput(&local_80,&local_558);
      Json::Value::operator=((Value *)&local_628,&local_80);
      Json::Value::~Value(&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._M_dataplus._M_p != &local_558.field_2) {
        operator_delete(local_558._M_dataplus._M_p);
      }
      Json::Value::Value(&local_1c0,(Value *)&local_628);
      pVVar12 = Json::Value::operator[](&logger,turnID);
      pVVar12 = Json::Value::operator[](pVVar12,0);
      Json::Value::operator=(pVVar12,&local_1c0);
      Json::Value::~Value(&local_1c0);
      Json::Value::Value(&local_1e8,(Value *)&local_4d8);
      pVVar12 = Json::Value::operator[](&logger,turnID);
      pVVar12 = Json::Value::operator[](pVVar12,1);
      Json::Value::operator=(pVVar12,&local_1e8);
      Json::Value::~Value(&local_1e8);
      pVVar12 = Json::Value::operator[](&logger,turnID + -1);
      pVVar12 = Json::Value::operator[](pVVar12,0);
      pVVar12 = Json::Value::operator[](pVVar12,"block");
      IVar7 = Json::Value::asInt(pVVar12);
      pVVar12 = Json::Value::operator[]((Value *)&local_4d8,"y");
      IVar8 = Json::Value::asInt(pVVar12);
      pVVar12 = Json::Value::operator[]((Value *)&local_4d8,"x");
      IVar9 = Json::Value::asInt(pVVar12);
      pVVar12 = Json::Value::operator[]((Value *)&local_4d8,"o");
      IVar10 = Json::Value::asInt(pVVar12);
      bVar3 = GameBoard::place(&gameBoard,0,IVar7,IVar8,IVar9,IVar10);
      pVVar12 = Json::Value::operator[](&logger,turnID + -1);
      pVVar12 = Json::Value::operator[](pVVar12,0);
      pVVar12 = Json::Value::operator[](pVVar12,"block");
      IVar7 = Json::Value::asInt(pVVar12);
      piVar1 = gameBoard.typeCountForColor[0] + IVar7;
      *piVar1 = *piVar1 + 1;
      pVVar12 = Json::Value::operator[](&logger,turnID + -1);
      pVVar12 = Json::Value::operator[](pVVar12,1);
      pVVar12 = Json::Value::operator[](pVVar12,"block");
      IVar7 = Json::Value::asInt(pVVar12);
      pVVar12 = Json::Value::operator[]((Value *)&local_628,"y");
      IVar8 = Json::Value::asInt(pVVar12);
      pVVar12 = Json::Value::operator[]((Value *)&local_628,"x");
      IVar9 = Json::Value::asInt(pVVar12);
      pVVar12 = Json::Value::operator[]((Value *)&local_628,"o");
      IVar10 = Json::Value::asInt(pVVar12);
      bVar4 = GameBoard::place(&gameBoard,1,IVar7,IVar8,IVar9,IVar10);
      pVVar12 = Json::Value::operator[](&logger,turnID + -1);
      pVVar12 = Json::Value::operator[](pVVar12,1);
      pVVar12 = Json::Value::operator[](pVVar12,"block");
      IVar7 = Json::Value::asInt(pVVar12);
      piVar1 = gameBoard.typeCountForColor[1] + IVar7;
      *piVar1 = *piVar1 + 1;
      if (bVar3) {
        bVar3 = GameBoard::typeCountError(&gameBoard,1);
        if (bVar4) {
LAB_0010cbf9:
          bVar4 = GameBoard::typeCountError(&gameBoard,0);
          if (bVar3 == false) {
            if (bVar4) goto LAB_0010ccd1;
            GameBoard::eliminate(&gameBoard,0);
            GameBoard::eliminate(&gameBoard,1);
            iVar5 = GameBoard::transfer(&gameBoard);
            if (iVar5 == -1) {
              pVVar12 = Json::Value::operator[]((Value *)&local_628,"block");
              IVar7 = Json::Value::asInt(pVVar12);
              bVar3 = GameBoard::canPut(&gameBoard,0,IVar7);
              pVVar12 = Json::Value::operator[]((Value *)&local_4d8,"block");
              IVar7 = Json::Value::asInt(pVVar12);
              bVar4 = GameBoard::canPut(&gameBoard,1,IVar7);
              if (bVar3 || bVar4) {
                __n = (size_t)local_6bc;
                if (!bVar4) {
                  __n = 0;
                }
                if (!bVar3) {
                  __n = 1;
                }
              }
              else {
                __n = 0xfffffffe;
                if (gameBoard.elimTotal[0] != gameBoard.elimTotal[1]) {
                  __n = (size_t)(gameBoard.elimTotal[0] < gameBoard.elimTotal[1]);
                }
              }
              if (bVar3 && bVar4) {
                if (turnID == 300) goto LAB_0010cc41;
                turnID = turnID + 1;
                bVar3 = true;
                goto LAB_0010cc48;
              }
            }
            else {
              __n = (size_t)(1 - iVar5);
            }
          }
          else {
            puts("player 0 error");
            if (bVar4) goto LAB_0010cc35;
            __n = 1;
          }
          goto LAB_0010cc46;
        }
        if (bVar3) goto LAB_0010cc29;
LAB_0010ccd1:
        puts("player 1 error");
        bVar3 = false;
        __n = 0;
        if (local_6bc == 1) goto LAB_0010cc41;
      }
      else {
        bVar3 = true;
        if (bVar4) goto LAB_0010cbf9;
LAB_0010cc29:
        puts("player 0 error");
LAB_0010cc35:
        puts("player 1 error");
LAB_0010cc41:
        __n = 0xfffffffe;
LAB_0010cc46:
        bVar3 = false;
      }
LAB_0010cc48:
      local_6bc = (uint)__n;
      Json::Value::~Value((Value *)&local_628);
      Json::Value::~Value((Value *)&local_4d8);
      if (local_5b8 != &local_5a8) {
        operator_delete(local_5b8);
      }
      if (local_598 != &local_588) {
        operator_delete(local_598);
      }
      if ((undefined1 *)local_6b8._0_8_ != local_6b8 + 0x10) {
        operator_delete((void *)local_6b8._0_8_);
      }
      if (local_650 != &local_640) {
        operator_delete(local_650.string_);
      }
    } while (bVar3);
    std::ofstream::ofstream(&local_4d8,*(char **)(local_6b8._96_8_ + 0x18),_S_out);
    Json::StyledWriter::StyledWriter((StyledWriter *)&local_628);
    Json::Value::Value((Value *)&local_650,nullValue);
    if (0 < turnID) {
      iVar5 = 0;
      do {
        pVVar12 = Json::Value::operator[]((Value *)&local_650,iVar5);
        pVVar12 = Json::Value::operator[](pVVar12,"output");
        Json::Value::Value(&local_f8,"request");
        pVVar14 = Json::Value::operator[](pVVar12,"command");
        Json::Value::operator=(pVVar14,&local_f8);
        Json::Value::~Value(&local_f8);
        pVVar12 = Json::Value::operator[](pVVar12,"display");
        pVVar14 = Json::Value::operator[](&logger,iVar5);
        pVVar14 = Json::Value::operator[](pVVar14,1);
        pVVar14 = Json::Value::operator[](pVVar14,"block");
        Json::Value::Value(&local_210,pVVar14);
        pVVar14 = Json::Value::operator[](pVVar12,"0");
        pVVar14 = Json::Value::operator[](pVVar14,"block");
        Json::Value::operator=(pVVar14,&local_210);
        Json::Value::~Value(&local_210);
        pVVar14 = Json::Value::operator[](&logger,iVar5);
        pVVar14 = Json::Value::operator[](pVVar14,0);
        pVVar14 = Json::Value::operator[](pVVar14,"block");
        Json::Value::Value(&local_238,pVVar14);
        pVVar12 = Json::Value::operator[](pVVar12,"1");
        pVVar12 = Json::Value::operator[](pVVar12,"block");
        Json::Value::operator=(pVVar12,&local_238);
        iVar5 = iVar5 + 1;
        Json::Value::~Value(&local_238);
        pVVar12 = Json::Value::operator[]((Value *)&local_650,iVar5);
        pVVar12 = Json::Value::operator[](pVVar12,"output");
        pVVar12 = Json::Value::operator[](pVVar12,"display");
        pVVar14 = Json::Value::operator[](&logger,iVar5);
        pVVar14 = Json::Value::operator[](pVVar14,1);
        Json::Value::Value(&local_260,pVVar14);
        pVVar14 = Json::Value::operator[](pVVar12,"0");
        pVVar14 = Json::Value::operator[](pVVar14,"route");
        pVVar14 = Json::Value::operator[](pVVar14,0);
        Json::Value::operator=(pVVar14,&local_260);
        Json::Value::~Value(&local_260);
        pVVar14 = Json::Value::operator[](pVVar12,"0");
        pVVar14 = Json::Value::operator[](pVVar14,"route");
        pVVar14 = Json::Value::operator[](pVVar14,0);
        Json::Value::removeMember(&local_a8,pVVar14,"block");
        Json::Value::~Value(&local_a8);
        pVVar14 = Json::Value::operator[](&logger,iVar5);
        pVVar14 = Json::Value::operator[](pVVar14,0);
        Json::Value::Value(&local_288,pVVar14);
        pVVar14 = Json::Value::operator[](pVVar12,"1");
        pVVar14 = Json::Value::operator[](pVVar14,"route");
        pVVar14 = Json::Value::operator[](pVVar14,0);
        Json::Value::operator=(pVVar14,&local_288);
        Json::Value::~Value(&local_288);
        pVVar12 = Json::Value::operator[](pVVar12,"1");
        pVVar12 = Json::Value::operator[](pVVar12,"route");
        pVVar12 = Json::Value::operator[](pVVar12,0);
        Json::Value::removeMember(&local_d0,pVVar12,"block");
        Json::Value::~Value(&local_d0);
      } while (iVar5 < turnID);
    }
    pVVar12 = Json::Value::operator[]((Value *)&local_650,turnID);
    pVVar12 = Json::Value::operator[](pVVar12,"output");
    Json::Value::Value(&local_2b0,"finish");
    pVVar14 = Json::Value::operator[](pVVar12,"command");
    Json::Value::operator=(pVVar14,&local_2b0);
    Json::Value::~Value(&local_2b0);
    uVar2 = 1 - local_6bc;
    if ((int)local_6bc < 0) {
      uVar2 = local_6bc;
    }
    Json::Value::Value(&local_2d8,uVar2);
    pVVar12 = Json::Value::operator[](pVVar12,"display");
    pVVar12 = Json::Value::operator[](pVVar12,"result");
    Json::Value::operator=(pVVar12,&local_2d8);
    Json::Value::~Value(&local_2d8);
    Json::StyledWriter::write_abi_cxx11_((StyledWriter *)local_6b8,(int)&local_628,&local_650,__n);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_4d8.bool_,(char *)local_6b8._0_8_,local_6b8._8_8_);
    if ((undefined1 *)local_6b8._0_8_ != local_6b8 + 0x10) {
      operator_delete((void *)local_6b8._0_8_);
    }
    std::ofstream::close();
    iVar5 = 0;
    printf("winner:%d\n",(ulong)local_6bc);
    Json::Value::~Value((Value *)&local_650);
    Json::StyledWriter::~StyledWriter((StyledWriter *)&local_628);
    local_4d8.int_ = _VTT;
    *(undefined8 *)((long)&local_4d8 + *(long *)(_VTT + -0x18)) = __filebuf;
    std::filebuf::~filebuf((filebuf *)&local_4d0);
    std::ios_base::~ios_base(local_3e0);
  }
  else {
    puts("usage: logic player1 player2 output");
    puts("this program will create lots of temporary files !!!");
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc != 4) {
        puts("usage: logic player1 player2 output");
        puts("this program will create lots of temporary files !!!");
        return 1;
    }

    int winner = -2;

    while (1) {
        printf("Round %d\n", turnID);
        if (turnID == 1) {
            srand(time(NULL));
            int first = rand() % 7;
            logger[0][0]["block"] = first;
            logger[0][0]["color"] = 0;
            logger[0][1]["block"] = first;
            logger[0][1]["color"] = 1;
        }
        string si0 = "in_" + to_string(turnID) + "_0.txt";
        string si1 = "in_" + to_string(turnID) + "_1.txt";
        makeInput(0, si0);
        makeInput(1, si1);
        string so0 = "out_" + to_string(turnID) + "_0.txt";
        string so1 = "out_" + to_string(turnID) + "_1.txt";
        system((string(argv[1]) + " < " + si0 + " > " + so0).c_str());
        system((string(argv[2]) + " < " + si1 + " > " + so1).c_str());
        Json::Value o0, o1;
        o0 = getOutput(so0);
        o1 = getOutput(so1);
        logger[turnID][0] = o1;
        logger[turnID][1] = o0;
        bool wa0, wa1;
        wa0 = !gameBoard.place(0, logger[turnID - 1][0]["block"].asInt(), o0["y"].asInt(), o0["x"].asInt(), o0["o"].asInt());
        ++gameBoard.typeCountForColor[0][logger[turnID - 1][0]["block"].asInt()];
        wa1 = !gameBoard.place(1, logger[turnID - 1][1]["block"].asInt(), o1["y"].asInt(), o1["x"].asInt(), o1["o"].asInt());
        ++gameBoard.typeCountForColor[1][logger[turnID - 1][1]["block"].asInt()];
        wa0 = wa0 || gameBoard.typeCountError(1);
        wa1 = wa1 || gameBoard.typeCountError(0);
        if (wa0) {
            puts("player 0 error");
            winner = 1;
        }
        if (wa1) {
            puts("player 1 error");
            if (winner != 1)
                winner = 0;
            else
                winner = -2;
        }
        if (wa0 || wa1)
            break;
        gameBoard.eliminate(0);
        gameBoard.eliminate(1);
        int wa = gameBoard.transfer();
        if (wa != -1) {
            winner = 1 - wa;
            break;
        }
        wa0 = !gameBoard.canPut(0, o1["block"].asInt());
        wa1 = !gameBoard.canPut(1, o0["block"].asInt());
        if (wa0 && wa1) {
            winner = gameBoard.elimTotal[0] - gameBoard.elimTotal[1];
            if (winner == 0)
                winner = -2;
            else
                winner = (winner < 0 ? 1 : 0);
        }
        else if (wa0)
            winner = 1;
        else if (wa1)
            winner = 0;
        if (wa0 || wa1)
            break;
        if (turnID == 300) {
            winner = -2;
            break;
        }
        ++turnID;
    }

    ofstream fout(argv[3]);
    Json::StyledWriter writer;
    Json::Value output;
    for (int i = 1; i <= turnID; ++i) {
        auto &o = output[i - 1]["output"];
        o["command"] = "request";
        auto &d = o["display"];
        d["0"]["block"] = logger[i - 1][1]["block"];
        d["1"]["block"] = logger[i - 1][0]["block"];
        auto &d2 = output[i]["output"]["display"];
        d2["0"]["route"][0] = logger[i][1];
        d2["0"]["route"][0].removeMember("block");
        d2["1"]["route"][0] = logger[i][0];
        d2["1"]["route"][0].removeMember("block");
    }
    auto &o = output[turnID]["output"];
    o["command"] = "finish";
    o["display"]["result"] = (winner >= 0 ? 1 - winner : winner);
    fout << writer.write(output);
    fout.close();
    printf("winner:%d\n",winner);
    return 0;
}